

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

int evfilt_read_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  
  if (((kn->kn_flags & 1) != 0) && (iVar1 = (kn->field_10).kn_timerfd, iVar1 != -1)) {
    if (kn->kn_registered != 0) {
      iVar1 = epoll_ctl(kn->kn_epollfd,2,iVar1,(epoll_event *)0x0);
      if (iVar1 < 0) {
        return -1;
      }
      iVar1 = (kn->field_10).kn_timerfd;
    }
    kn->kn_registered = 0;
    close(iVar1);
    (kn->field_10).kn_timerfd = -1;
    return 0;
  }
  iVar1 = epoll_update(2,filt,kn,1,true);
  return iVar1;
}

Assistant:

int
evfilt_read_knote_delete(struct filter *filt, struct knote *kn)
{
    if ((kn->kn_flags & KNFL_FILE) && (kn->kn_eventfd != -1)) {
        if (kn->kn_registered && epoll_ctl(kn->kn_epollfd, EPOLL_CTL_DEL, kn->kn_eventfd, NULL) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 0;
        (void) close(kn->kn_eventfd);
        kn->kn_eventfd = -1;
        return (0);
    }

    return epoll_update(EPOLL_CTL_DEL, filt, kn, EPOLLIN, true);
}